

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Bool BVar4;
  Stack *stack_00;
  bool bVar5;
  Node *local_58;
  int local_4c;
  tmbchar local_48 [4];
  uint indent;
  tmbchar indent_buf [32];
  Node *next;
  Stack *stack;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  stack_00 = prvTidynewStack(doc,0x10);
  stack = (Stack *)node;
  do {
    while( true ) {
      if (stack == (Stack *)0x0) {
        prvTidyfreeStack(stack_00);
        return;
      }
      indent_buf._24_8_ = stack->allocator;
      if ((((stack == (Stack *)0x0) || (stack[2].firstNode == (Node **)0x0)) ||
          (*(int *)stack[2].firstNode != 0xf)) || (stack[4].capacity == 0)) break;
      local_4c = 1;
      while( true ) {
        BVar4 = HasOneChild((Node *)stack);
        bVar5 = false;
        if (((BVar4 != no) &&
            (lVar1._0_4_ = stack[1].top, lVar1._4_4_ = stack[1].capacity, bVar5 = false, lVar1 != 0)
            ) && ((bVar5 = false, *(long *)(*(long *)(stack + 1) + 0x38) != 0 &&
                  (bVar5 = false, **(int **)(*(long *)(stack + 1) + 0x38) == 0xf)))) {
          bVar5 = stack[4].capacity != 0;
        }
        if (!bVar5) break;
        local_4c = local_4c + 1;
        StripOnlyChild(doc,(Node *)stack);
      }
      prvTidytmbsnprintf(local_48,0x20,"margin-left: %dem",(ulong)(uint)(local_4c << 1));
      RenameElem(doc,(Node *)stack,TidyTag_DIV);
      prvTidyAddStyleProperty(doc,(Node *)stack,local_48);
      lVar2._0_4_ = stack[1].top;
      lVar2._4_4_ = stack[1].capacity;
      if (lVar2 == 0) {
LAB_0016105c:
        if (indent_buf._24_8_ == 0) {
          local_58 = prvTidypop(stack_00);
        }
        else {
          local_58 = (Node *)indent_buf._24_8_;
        }
        stack = (Stack *)local_58;
      }
      else {
        prvTidypush(stack_00,(Node *)indent_buf._24_8_);
        stack = *(Stack **)(stack + 1);
      }
    }
    lVar3._0_4_ = stack[1].top;
    lVar3._4_4_ = stack[1].capacity;
    if (lVar3 == 0) goto LAB_0016105c;
    prvTidypush(stack_00,(Node *)indent_buf._24_8_);
    stack = *(Stack **)(stack + 1);
  } while( true );
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node *next;
    
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        next = node->next;
        
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );

            if (node->content)
            {
                TY_(push)(stack, next);
                node = node->content;
                continue;
            }
        }
        else if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}